

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamProgram.cpp
# Opt level: O2

void __thiscall BamTools::SamProgram::SamProgram(SamProgram *this,string *id)

{
  (this->CommandLine)._M_dataplus._M_p = (pointer)&(this->CommandLine).field_2;
  (this->CommandLine)._M_string_length = 0;
  (this->CommandLine).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->ID,(string *)id);
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->PreviousProgramID)._M_dataplus._M_p = (pointer)&(this->PreviousProgramID).field_2;
  (this->PreviousProgramID)._M_string_length = 0;
  (this->PreviousProgramID).field_2._M_local_buf[0] = '\0';
  (this->Version)._M_dataplus._M_p = (pointer)&(this->Version).field_2;
  (this->Version)._M_string_length = 0;
  (this->Version).field_2._M_local_buf[0] = '\0';
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CustomTags).
  super__Vector_base<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->NextProgramID)._M_dataplus._M_p = (pointer)&(this->NextProgramID).field_2;
  (this->NextProgramID)._M_string_length = 0;
  (this->NextProgramID).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

SamProgram::SamProgram(const std::string& id)
    : ID(id)
{}